

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_predictive_encoder.h
# Opt level: O2

bool __thiscall
draco::MeshEdgebreakerTraversalPredictiveEncoder::Init
          (MeshEdgebreakerTraversalPredictiveEncoder *this,
          MeshEdgebreakerEncoderImplInterface *encoder)

{
  int iVar1;
  VertexIndex v;
  undefined4 extraout_var;
  pointer piVar3;
  CornerTable *pCVar2;
  
  (this->super_MeshEdgebreakerTraversalEncoder).encoder_impl_ = encoder;
  iVar1 = (*encoder->_vptr_MeshEdgebreakerEncoderImplInterface[8])(encoder);
  pCVar2 = (CornerTable *)CONCAT44(extraout_var,iVar1);
  this->corner_table_ = pCVar2;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->vertex_valences_,
             (long)(int)((ulong)((long)(pCVar2->vertex_corners_).vector_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pCVar2->vertex_corners_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2));
  piVar3 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (v.value_ = 0;
      (ulong)v.value_ <
      (ulong)((long)(this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar3 >> 2); v.value_ = v.value_ + 1)
  {
    iVar1 = CornerTable::Valence(this->corner_table_,v);
    piVar3 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3[v.value_] = iVar1;
  }
  return true;
}

Assistant:

bool Init(MeshEdgebreakerEncoderImplInterface *encoder) {
    if (!MeshEdgebreakerTraversalEncoder::Init(encoder)) {
      return false;
    }
    corner_table_ = encoder->GetCornerTable();
    // Initialize valences of all vertices.
    vertex_valences_.resize(corner_table_->num_vertices());
    for (uint32_t i = 0; i < vertex_valences_.size(); ++i) {
      vertex_valences_[i] = corner_table_->Valence(VertexIndex(i));
    }
    return true;
  }